

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O0

void __thiscall
TPZFileEqnStorage<std::complex<long_double>_>::TPZFileEqnStorage
          (TPZFileEqnStorage<std::complex<long_double>_> *this,void **vtt,char option,string *name)

{
  char *pcVar1;
  FILE *pFVar2;
  string *in_RCX;
  char in_DL;
  undefined8 *in_RSI;
  TPZSavable *in_RDI;
  int zero;
  int64_t sizereturn;
  TPZStack<long,_10> *in_stack_ffffffffffffff90;
  TPZFileEqnStorage<std::complex<long_double>_> *this_00;
  undefined4 local_3c;
  size_t local_38;
  string *local_20;
  char local_11;
  
  local_20 = in_RCX;
  local_11 = in_DL;
  TPZSavable::TPZSavable(in_RDI,(void **)(in_RSI + 1));
  in_RDI->_vptr_TPZSavable = (_func_int **)*in_RSI;
  TPZStack<long,_10>::TPZStack(in_stack_ffffffffffffff90);
  this_00 = (TPZFileEqnStorage<std::complex<long_double>_> *)(in_RDI + 0x10);
  std::__cxx11::string::string((string *)this_00);
  *(undefined4 *)((long)&in_RDI[0x15]._vptr_TPZSavable + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x16]._vptr_TPZSavable = 0;
  *(undefined4 *)&in_RDI[0x15]._vptr_TPZSavable = 0;
  *(undefined4 *)&in_RDI[1]._vptr_TPZSavable = 0x14;
  std::__cxx11::string::operator=((string *)this_00,local_20);
  if (local_11 == 'r') {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pFVar2 = fopen(pcVar1,"rb");
    in_RDI[0x14]._vptr_TPZSavable = (_func_int **)pFVar2;
    local_38 = 0;
    local_38 = fread(in_RDI + 1,4,1,(FILE *)in_RDI[0x14]._vptr_TPZSavable);
    local_38 = fread(in_RDI + 0x16,4,1,(FILE *)in_RDI[0x14]._vptr_TPZSavable);
    ReadBlockPositions(this_00);
  }
  else if (local_11 == 'w') {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pFVar2 = fopen(pcVar1,"wb");
    in_RDI[0x14]._vptr_TPZSavable = (_func_int **)pFVar2;
    local_3c = 0;
    fwrite(in_RDI + 1,4,1,(FILE *)in_RDI[0x14]._vptr_TPZSavable);
    fwrite(&local_3c,4,1,(FILE *)in_RDI[0x14]._vptr_TPZSavable);
  }
  return;
}

Assistant:

TPZFileEqnStorage<TVar>::TPZFileEqnStorage(char option, const std::string & name)
: TPZRegisterClassId(&TPZFileEqnStorage<TVar>::ClassId)
{
	fCurBlockPosition = -1;
	fNumBlocks=0;
	fCurrentBlock=0;
	fNumHeaders=20;
	fFileName = name;
	if(option=='r'){
		fIOStream = fopen(fFileName.c_str(),"rb"); //open for reading
		/**
		 *Opens binary files and get initial information
		 *use this information for storage requirements
		 */
		int64_t sizereturn;
		sizereturn = 0;
		sizereturn = fread(&fNumHeaders,sizeof(int),1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != 1) DebugStop();
#endif
		sizereturn = fread(&fNumBlocks,sizeof(int),1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != 1) DebugStop();
#endif
		ReadBlockPositions();
	}else if(option=='w'){
		fIOStream = fopen(fFileName.c_str(),"wb"); //open for writing
		/**
		 *Writes NumHeaders and NumBlocks information in
		 *the two initial positions on fIOStream
		 */
		int zero = 0;
		fwrite(&fNumHeaders,sizeof(int),1,fIOStream);
		fwrite(&zero,sizeof(int),1,fIOStream);
		//fCurBlockPosition = ftell(fIOStream);
	}
}